

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void gola_resolve(LexState *ls,FuncScope *bl,MSize idx)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  FuncState *fs;
  VarInfo *pVVar4;
  VarInfo *pVVar5;
  
  if (bl->vstart < idx) {
    pVVar5 = ls->vstack + idx;
    pVVar4 = ls->vstack + bl->vstart;
    do {
      uVar2 = (pVVar4->name).gcptr32;
      if ((uVar2 == (pVVar5->name).gcptr32) && ((pVVar4->info & 2) != 0)) {
        bVar1 = pVVar5->slot;
        if (pVVar4->slot < bVar1) {
          uVar3 = ls->vstack[ls->fs->varmap[pVVar4->slot]].name.gcptr32;
          ls->linenumber = ls->fs->bcbase[pVVar4->startpc].line;
          lj_lex_error(ls,0,LJ_ERR_XGSCOPE,(ulong)uVar2 + 0x10,(ulong)uVar3 + 0x10);
        }
        fs = ls->fs;
        uVar2 = pVVar4->startpc;
        (pVVar4->name).gcptr32 = 0;
        *(byte *)((long)&fs->bcbase[uVar2].ins + 1) = bVar1;
        jmp_patch(fs,uVar2,pVVar5->startpc);
      }
      pVVar4 = pVVar4 + 1;
    } while (pVVar4 < pVVar5);
  }
  return;
}

Assistant:

static void gola_resolve(LexState *ls, FuncScope *bl, MSize idx)
{
  VarInfo *vg = ls->vstack + bl->vstart;
  VarInfo *vl = ls->vstack + idx;
  for (; vg < vl; vg++)
    if (gcrefeq(vg->name, vl->name) && gola_isgoto(vg)) {
      if (vg->slot < vl->slot) {
	GCstr *name = strref(var_get(ls, ls->fs, vg->slot).name);
	lua_assert((uintptr_t)name >= VARNAME__MAX);
	ls->linenumber = ls->fs->bcbase[vg->startpc].line;
	lua_assert(strref(vg->name) != NAME_BREAK);
	lj_lex_error(ls, 0, LJ_ERR_XGSCOPE,
		     strdata(strref(vg->name)), strdata(name));
      }
      gola_patch(ls, vg, vl);
    }
}